

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

void Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>::
     TraceFixedFieldsAfterSetIsProto
               (DynamicObject *instance,DynamicTypeHandler *oldTypeHandler,
               DynamicTypeHandler *newTypeHandler,DynamicType *oldType,
               RecyclerWeakReference<Js::DynamicObject> *oldSingletonInstanceBefore)

{
  bool bVar1;
  int iVar2;
  RecyclerWeakReference<Js::DynamicObject> *this;
  RecyclerWeakReference<Js::DynamicObject> *this_00;
  Type *pTVar3;
  DynamicType *pDVar4;
  char16_t *pcVar5;
  undefined4 extraout_var_01;
  char16_t *pcVar6;
  char16_t *local_90;
  DynamicObject *local_78;
  DynamicObject *local_60;
  RecyclerWeakReference<Js::DynamicObject> *newSingletonInstanceAfter;
  RecyclerWeakReference<Js::DynamicObject> *oldSingletonInstanceAfter;
  RecyclerWeakReference<Js::DynamicObject> *oldSingletonInstanceBefore_local;
  DynamicType *oldType_local;
  DynamicTypeHandler *newTypeHandler_local;
  DynamicTypeHandler *oldTypeHandler_local;
  DynamicObject *instance_local;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  bVar1 = Phases::IsEnabled((Phases *)&DAT_01ec1678,FixMethodPropsPhase);
  if ((bVar1) && ((DAT_01ec73ca & 1) != 0)) {
    iVar2 = (*oldTypeHandler->_vptr_DynamicTypeHandler[0x5f])();
    this = (RecyclerWeakReference<Js::DynamicObject> *)CONCAT44(extraout_var,iVar2);
    iVar2 = (*newTypeHandler->_vptr_DynamicTypeHandler[0x5f])();
    this_00 = (RecyclerWeakReference<Js::DynamicObject> *)CONCAT44(extraout_var_00,iVar2);
    pTVar3 = RecyclableObject::GetType(&instance->super_RecyclableObject);
    if (this == (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
      local_60 = (DynamicObject *)0x0;
    }
    else {
      local_60 = Memory::RecyclerWeakReference<Js::DynamicObject>::Get(this);
    }
    if (this_00 == (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
      local_78 = (DynamicObject *)0x0;
    }
    else {
      local_78 = Memory::RecyclerWeakReference<Js::DynamicObject>::Get(this_00);
    }
    Output::Print(L"   after: type = 0x%p, type handler = 0x%p, old singleton = 0x%p(0x%p), new singleton = 0x%p(0x%p)\n"
                  ,pTVar3,newTypeHandler,this,local_60,this_00,local_78);
    Output::Print(L"   fixed fields:");
    (*newTypeHandler->_vptr_DynamicTypeHandler[0x5e])();
    Output::Print(L"\n");
    Output::Flush();
  }
  bVar1 = Phases::IsEnabled((Phases *)&DAT_01ec73f0,FixMethodPropsPhase);
  if ((bVar1) && ((DAT_01ec73ca & 1) != 0)) {
    pDVar4 = (DynamicType *)RecyclableObject::GetType(&instance->super_RecyclableObject);
    pcVar5 = L"unchanged";
    if (oldType != pDVar4) {
      pcVar5 = L"changed";
    }
    if (oldSingletonInstanceBefore == (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
      local_90 = L"==";
    }
    else {
      local_90 = L"!=";
    }
    iVar2 = (*oldTypeHandler->_vptr_DynamicTypeHandler[0x5f])();
    pcVar6 = L"unchanged";
    if (oldSingletonInstanceBefore !=
        (RecyclerWeakReference<Js::DynamicObject> *)CONCAT44(extraout_var_01,iVar2)) {
      pcVar6 = L"changed";
    }
    Output::Print(L"   type %s, old singleton after %s null (%s)\n",pcVar5,local_90,pcVar6);
    Output::Print(L"   fixed fields after:");
    (*newTypeHandler->_vptr_DynamicTypeHandler[0x5e])();
    Output::Print(L"\n");
    Output::Flush();
  }
  return;
}

Assistant:

void SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::TraceFixedFieldsAfterSetIsProto(
        DynamicObject* instance, DynamicTypeHandler* oldTypeHandler, DynamicTypeHandler* newTypeHandler,
        DynamicType* oldType, RecyclerWeakReference<DynamicObject>* oldSingletonInstanceBefore)
    {
        if (PHASE_VERBOSE_TRACE1(FixMethodPropsPhase))
        {
            RecyclerWeakReference<DynamicObject>* oldSingletonInstanceAfter = oldTypeHandler->GetSingletonInstance();
            RecyclerWeakReference<DynamicObject>* newSingletonInstanceAfter = newTypeHandler->GetSingletonInstance();
            Output::Print(_u("   after: type = 0x%p, type handler = 0x%p, old singleton = 0x%p(0x%p), new singleton = 0x%p(0x%p)\n"),
                instance->GetType(), newTypeHandler,
                oldSingletonInstanceAfter, oldSingletonInstanceAfter != nullptr ? oldSingletonInstanceAfter->Get() : nullptr,
                newSingletonInstanceAfter, newSingletonInstanceAfter != nullptr ? newSingletonInstanceAfter->Get() : nullptr);
            Output::Print(_u("   fixed fields:"));
            newTypeHandler->DumpFixedFields();
            Output::Print(_u("\n"));
            Output::Flush();
        }
        if (PHASE_VERBOSE_TESTTRACE1(FixMethodPropsPhase))
        {
            Output::Print(_u("   type %s, old singleton after %s null (%s)\n"),
                oldType != instance->GetType() ? _u("changed") : _u("unchanged"),
                oldSingletonInstanceBefore == nullptr ? _u("==") : _u("!="),
                oldSingletonInstanceBefore != oldTypeHandler->GetSingletonInstance() ? _u("changed") : _u("unchanged"));
            Output::Print(_u("   fixed fields after:"));
            newTypeHandler->DumpFixedFields();
            Output::Print(_u("\n"));
            Output::Flush();
        }
    }